

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

ostream * Search::operator<<(ostream *os,action_cache *x)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  uStack_18._0_7_ = CONCAT16(0x3a,(undefined6)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 6),1);
  std::ostream::_M_insert<double>((double)x->cost);
  if (x->is_opt == true) {
    uStack_18 = CONCAT17(0x2a,(undefined7)uStack_18);
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_18 + 7),1);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const action_cache& x)
{
  os << x.k << ':' << x.cost;
  if (x.is_opt)
    os << '*';
  return os;
}